

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O0

void __thiscall
FlatMap<double,MyStruct,std::less<double>>::insert<std::pair<double,MyStruct>const*>
          (FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,pair<double,_MyStruct> *first,pair<double,_MyStruct> *last)

{
  const_iterator __position;
  iterator iVar1;
  iterator iVar2;
  iterator iVar3;
  long in_RDX;
  long in_RSI;
  __normal_iterator<std::pair<double,_MyStruct>_*,_std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>_>
  in_RDI;
  __normal_iterator<std::pair<double,_MyStruct>_*,_std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>_>
  newLast;
  iterator insertStart;
  vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>
  *in_stack_ffffffffffffff48;
  anon_class_8_1_8991fb9c_for__M_comp in_stack_ffffffffffffff68;
  const_iterator in_stack_ffffffffffffff70;
  __normal_iterator<std::pair<double,_MyStruct>_*,_std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>_>
  __first;
  pair<double,_MyStruct> *in_stack_ffffffffffffff80;
  pair<double,_MyStruct> *in_stack_ffffffffffffff88;
  vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>
  *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  
  if (in_RSI != in_RDX) {
    std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>::end
              (in_stack_ffffffffffffff48);
    __gnu_cxx::
    __normal_iterator<std::pair<double,MyStruct>const*,std::vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>>
    ::__normal_iterator<std::pair<double,MyStruct>*>
              ((__normal_iterator<const_std::pair<double,_MyStruct>_*,_std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>_>
                *)in_RDI._M_current,
               (__normal_iterator<std::pair<double,_MyStruct>_*,_std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>_>
                *)in_stack_ffffffffffffff48);
    __position._M_current._7_1_ = in_stack_ffffffffffffff9f;
    __position._M_current._0_7_ = in_stack_ffffffffffffff98;
    iVar1 = std::vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>::
            insert<std::pair<double,MyStruct>const*,void>
                      (in_stack_ffffffffffffff90,__position,in_stack_ffffffffffffff88,
                       in_stack_ffffffffffffff80);
    iVar2 = std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>
            ::end(in_stack_ffffffffffffff48);
    std::
    stable_sort<__gnu_cxx::__normal_iterator<std::pair<double,MyStruct>*,std::vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>>,FlatMap<double,MyStruct,std::less<double>>::ValueToValueComparator>
              (iVar1._M_current,iVar2._M_current);
    iVar2 = std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>
            ::begin(in_stack_ffffffffffffff48);
    iVar3 = std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>
            ::end(in_stack_ffffffffffffff48);
    std::
    inplace_merge<__gnu_cxx::__normal_iterator<std::pair<double,MyStruct>*,std::vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>>,FlatMap<double,MyStruct,std::less<double>>::ValueToValueComparator>
              (iVar2._M_current,iVar1._M_current,iVar3._M_current);
    std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>::begin
              (in_stack_ffffffffffffff48);
    std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>::end
              (in_stack_ffffffffffffff48);
    __first._M_current = in_RDI._M_current;
    std::
    unique<__gnu_cxx::__normal_iterator<std::pair<double,MyStruct>*,std::vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>>,FlatMap<double,MyStruct,std::less<double>>::insert<std::pair<double,MyStruct>const*>(std::pair<double,MyStruct>const*,std::pair<double,MyStruct>const*)::_lambda(std::pair<double,MyStruct>const&,std::pair<double,MyStruct>const&)_1_>
              (in_RDI,(__normal_iterator<std::pair<double,_MyStruct>_*,_std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>_>
                       )in_stack_ffffffffffffff70._M_current,in_stack_ffffffffffffff68);
    __gnu_cxx::
    __normal_iterator<std::pair<double,MyStruct>const*,std::vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>>
    ::__normal_iterator<std::pair<double,MyStruct>*>
              ((__normal_iterator<const_std::pair<double,_MyStruct>_*,_std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>_>
                *)in_RDI._M_current,
               (__normal_iterator<std::pair<double,_MyStruct>_*,_std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>_>
                *)in_stack_ffffffffffffff48);
    std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>::end
              (in_stack_ffffffffffffff48);
    __gnu_cxx::
    __normal_iterator<std::pair<double,MyStruct>const*,std::vector<std::pair<double,MyStruct>,std::allocator<std::pair<double,MyStruct>>>>
    ::__normal_iterator<std::pair<double,MyStruct>*>
              ((__normal_iterator<const_std::pair<double,_MyStruct>_*,_std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>_>
                *)in_RDI._M_current,
               (__normal_iterator<std::pair<double,_MyStruct>_*,_std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>_>
                *)in_stack_ffffffffffffff48);
    std::vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_>::erase
              ((vector<std::pair<double,_MyStruct>,_std::allocator<std::pair<double,_MyStruct>_>_> *
               )in_stack_ffffffffffffff68.this,(const_iterator)__first._M_current,
               in_stack_ffffffffffffff70);
  }
  return;
}

Assistant:

void insert(InputIt first, InputIt last) {
        if (first == last) {
            return;
        }

        auto insertStart = vec_.insert(vec_.end(), first, last);
        std::stable_sort(insertStart, vec_.end(), valueToValueComp_);
        std::inplace_merge(vec_.begin(), insertStart, vec_.end(), valueToValueComp_);
        auto newLast = std::unique(vec_.begin(), vec_.end(), [this](const value_type& lhs, const value_type& rhs) {
            return !comp_(lhs.first, rhs.first);
        });
        vec_.erase(newLast, vec_.end());

        //mergeUnique(first, last);
    }